

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O3

void __thiscall Clasp::ClaspStatistics::Impl::visit(Impl *this,StatisticObject *obj,KeySet *visited)

{
  E EVar1;
  uint32 uVar2;
  iterator iVar3;
  reference ppIVar4;
  char *k;
  __hashtable *__h;
  uint32 uVar5;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar6;
  __node_gen_type __node_gen;
  StatisticObject local_38;
  
  local_38 = (StatisticObject)obj->handle_;
  iVar3 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)this,&local_38.handle_);
  if (((iVar3.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) &&
      (local_38.handle_ = (uint64)visited,
      pVar6 = std::
              _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                        ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)visited,
                         (long)iVar3.super__Node_iterator_base<unsigned_long,_false>._M_cur + 8),
      ((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) &&
     (obj->handle_ != 0)) {
    ppIVar4 = bk_lib::
              pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
              ::at((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                    *)StatisticObject::types_s,(uint)(ushort)(obj->handle_ >> 0x30));
    EVar1 = ((*ppIVar4)->type).val_;
    if (EVar1 == Array) {
      uVar2 = StatisticObject::size(obj);
      if (uVar2 != 0) {
        uVar5 = 0;
        do {
          local_38 = StatisticObject::operator[](obj,uVar5);
          visit(this,&local_38,visited);
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
    }
    else if ((EVar1 == Map) && (uVar2 = StatisticObject::size(obj), uVar2 != 0)) {
      uVar5 = 0;
      do {
        k = StatisticObject::key(obj,uVar5);
        local_38 = StatisticObject::at(obj,k);
        visit(this,&local_38,visited);
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
  }
  return;
}

Assistant:

void visit(const StatisticObject& obj, KeySet& visited) {
		KeySet::iterator it = objects_.find(obj.toRep());
		if (it == objects_.end() || !visited.insert(*it).second) { return; }
		switch (obj.type()) {
			case Potassco::Statistics_t::Map:
				for (uint32 i = 0, end = obj.size(); i != end; ++i) { visit(obj.at(obj.key(i)), visited); }
				break;
			case Potassco::Statistics_t::Array:
				for (uint32 i = 0, end = obj.size(); i != end; ++i) { visit(obj[i], visited); }
				break;
			default: break;
		}
	}